

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O3

void __thiscall
BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::Log
          (Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *this,string *msg)

{
  long lVar1;
  bool bVar2;
  Level level;
  Logger *this_00;
  int source_line;
  LogFlags LVar3;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  string full_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  LogMsg(&full_msg,this,msg);
  LVar3 = this->m_log_category;
  if (LVar3 == ALL) {
    level = Info;
    LVar3 = ALL;
    source_line = 0x38;
  }
  else {
    this_00 = LogInstance();
    bVar2 = Logger::WillLogCategoryLevel(this_00,LVar3,Debug);
    if (!bVar2) goto LAB_002e8be3;
    LVar3 = this->m_log_category;
    level = Debug;
    source_line = 0x3a;
  }
  logging_function._M_str = "Log";
  logging_function._M_len = 3;
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/logging/timer.h"
  ;
  source_file._M_len = 0x5f;
  LogPrintFormatInternal<std::__cxx11::string>
            (logging_function,source_file,source_line,LVar3,level,
             (ConstevalFormatString<1U>)0x86d2a1,&full_msg);
LAB_002e8be3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)full_msg._M_dataplus._M_p != &full_msg.field_2) {
    operator_delete(full_msg._M_dataplus._M_p,full_msg.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Log(const std::string& msg)
    {
        const std::string full_msg = this->LogMsg(msg);

        if (m_log_category == BCLog::LogFlags::ALL) {
            LogPrintf("%s\n", full_msg);
        } else {
            LogDebug(m_log_category, "%s\n", full_msg);
        }
    }